

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O1

void __thiscall SQCompiler::ClassStatement(SQCompiler *this)

{
  long lVar1;
  SQInteger SVar2;
  bool bVar3;
  undefined7 uVar4;
  SQInteger SVar5;
  char *s;
  SQExpState es;
  
  SVar5 = SQLexer::Lex(&this->_lex);
  this->_token = SVar5;
  SVar5 = (this->_es).etype;
  SVar2 = (this->_es).epos;
  bVar3 = (this->_es).donot_get;
  uVar4 = *(undefined7 *)&(this->_es).field_0x11;
  (this->_es).donot_get = true;
  PrefixedExpr(this);
  lVar1 = (this->_es).etype;
  if (lVar1 - 2U < 2) {
    ClassExp(this);
    EmitDerefOp(this,_OP_NEWSLOT);
    SQFuncState::PopTarget(this->_fs);
  }
  else {
    if (lVar1 == 1) {
      s = "invalid class name";
    }
    else {
      s = "cannot create a class in a local with the syntax(class <local>)";
    }
    Error(this,s);
  }
  (this->_es).donot_get = bVar3;
  *(undefined7 *)&(this->_es).field_0x11 = uVar4;
  (this->_es).etype = SVar5;
  (this->_es).epos = SVar2;
  return;
}

Assistant:

void ClassStatement()
    {
        SQExpState es;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype == EXPR) {
            Error(_SC("invalid class name"));
        }
        else if(_es.etype == OBJECT || _es.etype == BASE) {
            ClassExp();
            EmitDerefOp(_OP_NEWSLOT);
            _fs->PopTarget();
        }
        else {
            Error(_SC("cannot create a class in a local with the syntax(class <local>)"));
        }
        _es = es;
    }